

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

Notation icu_63::number::impl::stem_to_object::notation(StemEnum stem)

{
  ScientificNotation SVar1;
  Notation NVar2;
  undefined8 local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined8 local_78;
  undefined4 local_70;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 uStack_14;
  StemEnum stem_local;
  undefined4 local_c;
  
  switch(stem) {
  case STEM_COMPACT_SHORT:
    NVar2 = Notation::compactShort();
    local_28 = NVar2._0_8_;
    uStack_14 = local_28;
    local_20 = NVar2.fUnion._4_4_;
    local_c = local_20;
    break;
  case STEM_COMPACT_LONG:
    NVar2 = Notation::compactLong();
    local_38 = NVar2._0_8_;
    uStack_14 = local_38;
    local_30 = NVar2.fUnion._4_4_;
    local_c = local_30;
    break;
  case STEM_SCIENTIFIC:
    SVar1 = Notation::scientific();
    local_58 = SVar1.super_Notation._0_8_;
    local_50 = SVar1.super_Notation.fUnion._4_4_;
    uStack_14 = local_58;
    local_c = local_50;
    break;
  case STEM_ENGINEERING:
    SVar1 = Notation::engineering();
    local_78 = SVar1.super_Notation._0_8_;
    local_70 = SVar1.super_Notation.fUnion._4_4_;
    uStack_14 = local_78;
    local_c = local_70;
    break;
  case STEM_NOTATION_SIMPLE:
    NVar2 = Notation::simple();
    local_88 = NVar2._0_8_;
    uStack_14 = local_88;
    local_80 = NVar2.fUnion._4_4_;
    local_c = local_80;
    break;
  default:
    NVar2 = Notation::simple();
    local_98 = NVar2._0_8_;
    uStack_14 = local_98;
    local_90 = NVar2.fUnion._4_4_;
    local_c = local_90;
  }
  NVar2.fUnion.scientific.fExponentSignDisplay = local_c;
  NVar2._0_8_ = uStack_14;
  return NVar2;
}

Assistant:

Notation stem_to_object::notation(skeleton::StemEnum stem) {
    switch (stem) {
        case STEM_COMPACT_SHORT:
            return Notation::compactShort();
        case STEM_COMPACT_LONG:
            return Notation::compactLong();
        case STEM_SCIENTIFIC:
            return Notation::scientific();
        case STEM_ENGINEERING:
            return Notation::engineering();
        case STEM_NOTATION_SIMPLE:
            return Notation::simple();
        default:
            U_ASSERT(false);
            return Notation::simple(); // return a value: silence compiler warning
    }
}